

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O0

void k051649_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  DEV_SMPL *__s;
  DEV_SMPL *__s_00;
  int *piVar4;
  DEV_SMPL smpl;
  UINT32 offs;
  UINT32 step;
  UINT32 j;
  UINT32 i;
  DEV_SMPL *buffer2;
  DEV_SMPL *buffer;
  k051649_sound_channel *voice;
  k051649_state *info;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *param_local;
  
  __s = *outputs;
  __s_00 = outputs[1];
  memset(__s,0,(ulong)samples << 2);
  memset(__s_00,0,(ulong)samples << 2);
  for (offs = 0; offs < 5; offs = offs + 1) {
    if ((8 < *(int *)((long)param + (ulong)offs * 0x2c + 0xc)) &&
       (*(char *)((long)param + (ulong)offs * 0x2c + 0x32) == '\0')) {
      uVar1 = *(uint *)((long)param + 0xe4);
      iVar2 = *(int *)((long)param + 0xe8);
      iVar3 = *(int *)((long)param + (ulong)offs * 0x2c + 0xc);
      for (step = 0; step < samples; step = step + 1) {
        piVar4 = (int *)((long)param + (ulong)offs * 0x2c + 8);
        *piVar4 = (int)(long)((float)((ulong)uVar1 << 0x10) /
                              ((float)(uint)((iVar3 + 1) * iVar2) * 0.5) + 0.5) + *piVar4;
        if (*(char *)((long)param + (ulong)offs * 0x2c + 0x11) != '\0') {
          __s[step] = ((int)((int)*(char *)((long)param +
                                           (ulong)(*(uint *)((long)param + (ulong)offs * 0x2c + 8)
                                                   >> 0x10 & 0x1f) + (ulong)offs * 0x2c + 0x12) *
                            (uint)*(byte *)((long)param + (ulong)offs * 0x2c + 0x10)) >> 4) +
                      __s[step];
        }
      }
    }
  }
  for (step = 0; step < samples; step = step + 1) {
    __s[step] = (__s[step] << 8) / 8;
    __s_00[step] = __s[step];
  }
  return;
}

Assistant:

static void k051649_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	k051649_state *info = (k051649_state *)param;
	k051649_sound_channel *voice=info->channel_list;
	DEV_SMPL *buffer = outputs[0];
	DEV_SMPL *buffer2 = outputs[1];
	UINT32 i,j;

	// zap the contents of the mixer buffer
	memset(buffer, 0, samples * sizeof(DEV_SMPL));
	memset(buffer2, 0, samples * sizeof(DEV_SMPL));

	for (j = 0; j < 5; j++)
	{
		// channel is halted for freq < 9
		if (voice[j].frequency > 8 && ! voice[j].Muted)
		{
			UINT32 step = (UINT32)(((INT64)info->mclock * (1 << FREQ_BITS)) / (float)((voice[j].frequency + 1) * info->rate / 2.0f) + 0.5f);

			for (i = 0; i < samples; i++)
			{
				voice[j].counter += step;
				if (voice[j].key)
				{
					UINT32 offs = (voice[j].counter >> FREQ_BITS) & 0x1f;
					// 0x80 [wave] * 0x0F [volume] -> range +-0x780 per channel, 0x2580 total
					DEV_SMPL smpl = voice[j].waveram[offs] * voice[j].volume;
					// scale to 11 bit digital output on chip
					smpl >>= 4;	// results in [-600 .. +600]
					buffer[i] += smpl;
				}
			}
		}
	}
	for (i = 0; i < samples; i++)
	{
		// scale to +-0x7800 (fallback solution to keep volume intact)
		buffer[i] = buffer[i] * 256 / 8;
		buffer2[i] = buffer[i];
	}
}